

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t completed,size_t total)

{
  cmCTest *pcVar1;
  cmCTestTestProperties *pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  string *psVar8;
  cmCTestTestProperties *pcVar9;
  time_point tVar10;
  long lVar11;
  string *psVar12;
  pointer pbVar13;
  cmDuration testTimeOut;
  double dVar14;
  string msg_1;
  string testName;
  ostringstream cmCTestLog_msg;
  long alStack_1b8 [45];
  string local_50;
  
  this->TotalNumberOfTests = total;
  bVar4 = cmCTest::GetTestProgressOutput(this->CTest);
  if (bVar4) {
    GetTestPrefix_abi_cxx11_(&msg_1,this,completed,total);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,&msg_1,&this->TestProperties->Name);
    std::operator+(&testName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,"\n");
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&msg_1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,(string *)&testName);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x20f,msg_1._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&msg_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&testName);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar5 = getNumWidth(total);
    *(long *)((long)alStack_1b8 + *(long *)(_cmCTestLog_msg + -0x18)) = (long)(iVar5 * 2 + 8);
    poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"Start ");
    iVar5 = getNumWidth((long)this->TestHandler->MaxIndex);
    *(long *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = (long)iVar5;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->TestProperties->Index);
    poVar7 = std::operator<<(poVar7,": ");
    poVar7 = std::operator<<(poVar7,(string *)this->TestProperties);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x20b,testName._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&testName);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  (this->ProcessOutput)._M_string_length = 0;
  *(this->ProcessOutput)._M_dataplus._M_p = '\0';
  pcVar2 = this->TestProperties;
  (this->TestResult).Properties = pcVar2;
  (this->TestResult).ExecutionTime.__r = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  (this->TestResult).TestCount = pcVar2->Index;
  std::__cxx11::string::_M_assign((string *)&this->TestResult);
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
  psVar12 = &(this->TestResult).CompletionStatus;
  if (this->TestProperties->Disabled == true) {
    std::__cxx11::string::assign((char *)psVar12);
    (this->TestResult).Status = 0;
    std::__cxx11::string::assign((char *)&(this->TestResult).Output);
    (this->TestResult).FullCommandLine._M_string_length = 0;
    *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
    (this->TestResult).Environment._M_string_length = 0;
    *(this->TestResult).Environment._M_dataplus._M_p = '\0';
    return false;
  }
  std::__cxx11::string::assign((char *)psVar12);
  (this->TestResult).Status = 8;
  if ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ComputeArguments(this);
    pcVar2 = this->TestProperties;
    pbVar13 = (pcVar2->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar9 = pcVar2;
    if (0x20 < (ulong)((long)(pcVar2->Args).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13)) {
      bVar4 = std::operator==(pbVar13 + 1,"NOT_AVAILABLE");
      if (bVar4) {
        msg_1._M_dataplus._M_p = (pointer)&msg_1.field_2;
        msg_1._M_string_length = 0;
        msg_1.field_2._M_local_buf[0] = '\0';
        psVar8 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
        if (psVar8->_M_string_length == 0) {
          std::__cxx11::string::assign((char *)&msg_1);
        }
        else {
          _cmCTestLog_msg = (pointer)0x25;
          psVar8 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
          testName._M_string_length = (size_type)(psVar8->_M_dataplus)._M_p;
          testName._M_dataplus._M_p = (pointer)psVar8->_M_string_length;
          cmStrCat<char[3]>(&local_50,(cmAlphaNum *)&cmCTestLog_msg,(cmAlphaNum *)&testName,
                            (char (*) [3])0x67b310);
          std::__cxx11::string::operator=((string *)&msg_1,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        poVar7 = std::operator<<(this->TestHandler->LogFile,(string *)&msg_1);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&msg_1);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x248,testName._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&testName);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
        (this->TestResult).FullCommandLine._M_string_length = 0;
        *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
        (this->TestResult).Environment._M_string_length = 0;
        *(this->TestResult).Environment._M_dataplus._M_p = '\0';
        std::__cxx11::string::assign((char *)psVar12);
        (this->TestResult).Status = 0;
        psVar12 = &msg_1;
        goto LAB_00486a99;
      }
      pcVar9 = this->TestProperties;
    }
    pbVar3 = (pcVar9->RequiredFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar13 = (pcVar9->RequiredFiles).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar3;
        pbVar13 = pbVar13 + 1) {
      bVar4 = cmsys::SystemTools::FileExists(pbVar13);
      if (!bVar4) {
        poVar7 = std::operator<<(this->TestHandler->LogFile,"Unable to find required file: ");
        poVar7 = std::operator<<(poVar7,(string *)pbVar13);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"Unable to find required file: ");
        poVar7 = std::operator<<(poVar7,(string *)pbVar13);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,600,testName._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&testName);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCTestLog_msg,"Unable to find required file: ",pbVar13);
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).Output,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        (this->TestResult).FullCommandLine._M_string_length = 0;
        *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
        (this->TestResult).Environment._M_string_length = 0;
        *(this->TestResult).Environment._M_dataplus._M_p = '\0';
        goto LAB_00486e57;
      }
    }
    if ((this->ActualCommand)._M_string_length == 0) {
      poVar7 = std::operator<<(this->TestHandler->LogFile,"Unable to find executable: ");
      poVar7 = std::operator<<(poVar7,(string *)
                                      ((pcVar2->Args).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"Unable to find executable: ");
      poVar7 = std::operator<<(poVar7,(string *)
                                      ((pcVar2->Args).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x268,testName._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&testName);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,"Unable to find executable: ",
                     (pcVar2->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      std::__cxx11::string::operator=
                ((string *)&(this->TestResult).Output,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      (this->TestResult).FullCommandLine._M_string_length = 0;
      *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
      (this->TestResult).Environment._M_string_length = 0;
      *(this->TestResult).Environment._M_dataplus._M_p = '\0';
LAB_00486e57:
      bVar4 = false;
      std::__cxx11::string::assign((char *)psVar12);
      (this->TestResult).Status = 0;
    }
    else {
      cmCTest::CurrentTime_abi_cxx11_((string *)&cmCTestLog_msg,this->CTest);
      std::__cxx11::string::operator=((string *)&this->StartTime,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      testTimeOut.__r = (this->TestProperties->Timeout).__r;
      this->TimeoutIsForStopTime = false;
      tVar10 = cmCTest::GetStopTime(this->CTest);
      if (tVar10.__d.__r != 0) {
        lVar11 = std::chrono::_V2::system_clock::now();
        dVar14 = (double)(((long)tVar10.__d.__r - lVar11) % 86400000000000) / 1000000000.0;
        if (dVar14 <= 0.0) {
          dVar14 = 0.0;
        }
        if (((testTimeOut.__r == 0.0) && (!NAN(testTimeOut.__r))) || (dVar14 < testTimeOut.__r)) {
          this->TimeoutIsForStopTime = true;
          testTimeOut.__r = dVar14;
        }
      }
      pcVar2 = this->TestProperties;
      bVar4 = ForkProcess(this,testTimeOut,pcVar2->ExplicitTimeout,&pcVar2->Environment,
                          &pcVar2->EnvironmentModification,&pcVar2->Affinity);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testName,"Failed test dependencies:",(allocator<char> *)&cmCTestLog_msg);
    for (p_Var6 = (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var6 + 1));
      std::__cxx11::string::append((string *)&testName);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
    poVar7 = std::operator<<(this->TestHandler->LogFile,(string *)&testName);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&testName);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x233,msg_1._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&msg_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    (this->TestResult).FullCommandLine._M_string_length = 0;
    *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
    (this->TestResult).Environment._M_string_length = 0;
    *(this->TestResult).Environment._M_dataplus._M_p = '\0';
    std::__cxx11::string::assign((char *)psVar12);
    (this->TestResult).Status = 0;
    psVar12 = &testName;
LAB_00486a99:
    std::__cxx11::string::~string((string *)psVar12);
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t completed, size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::setw(2 * getNumWidth(total) + 8)
                 << "Start "
                 << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
                 << this->TestProperties->Index << ": "
                 << this->TestProperties->Name << std::endl);
  } else {
    std::string testName = this->GetTestPrefix(completed, total) +
      this->TestProperties->Name + "\n";
    cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, testName);
  }

  this->ProcessOutput.clear();

  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = cmDuration::zero();
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;

  // Return immediately if test is disabled
  if (this->TestProperties->Disabled) {
    this->TestResult.CompletionStatus = "Disabled";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    this->TestResult.Output = "Disabled";
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    return false;
  }

  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;

  // Check for failed fixture dependencies before we even look at the command
  // arguments because if we are not going to run the test, the command and
  // its arguments are irrelevant. This matters for the case where a fixture
  // dependency might be creating the executable we want to run.
  if (!this->FailedDependencies.empty()) {
    std::string msg = "Failed test dependencies:";
    for (std::string const& failedDep : this->FailedDependencies) {
      msg += " " + failedDep;
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    this->TestResult.CompletionStatus = "Fixture dependency failed";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  if (args.size() >= 2 && args[1] == "NOT_AVAILABLE") {
    std::string msg;
    if (this->CTest->GetConfigType().empty()) {
      msg = "Test not available without configuration.  (Missing \"-C "
            "<config>\"?)";
    } else {
      msg = cmStrCat("Test not available in configuration \"",
                     this->CTest->GetConfigType(), "\".");
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    this->TestResult.CompletionStatus = "Missing Configuration";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  // Check if all required files exist
  for (std::string const& file : this->TestProperties->RequiredFiles) {
    if (!cmSystemTools::FileExists(file)) {
      // Required file was not found
      *this->TestHandler->LogFile << "Unable to find required file: " << file
                                  << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to find required file: " << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine.clear();
      this->TestResult.Environment.clear();
      this->TestResult.CompletionStatus = "Required Files Missing";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
    }
  }
  // log and return if we did not find the executable
  if (this->ActualCommand.empty()) {
    // if the command was not found create a TestResult object
    // that has that information
    *this->TestHandler->LogFile << "Unable to find executable: " << args[1]
                                << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to find executable: " << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    this->TestResult.CompletionStatus = "Unable to find executable";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }
  this->StartTime = this->CTest->CurrentTime();

  auto timeout = this->TestProperties->Timeout;

  this->TimeoutIsForStopTime = false;
  std::chrono::system_clock::time_point stop_time = this->CTest->GetStopTime();
  if (stop_time != std::chrono::system_clock::time_point()) {
    std::chrono::duration<double> stop_timeout =
      (stop_time - std::chrono::system_clock::now()) % std::chrono::hours(24);

    if (stop_timeout <= std::chrono::duration<double>::zero()) {
      stop_timeout = std::chrono::duration<double>::zero();
    }
    if (timeout == std::chrono::duration<double>::zero() ||
        stop_timeout < timeout) {
      this->TimeoutIsForStopTime = true;
      timeout = stop_timeout;
    }
  }

  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment,
                           &this->TestProperties->EnvironmentModification,
                           &this->TestProperties->Affinity);
}